

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets
          (cmGlobalGenerator *this,TargetTypes targetTypes,cmMakefile *mf,cmLocalGenerator *lg,
          map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *importedMap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  cmGeneratorTarget *this_00;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Hash_node_base *p_Var5;
  pointer ppcVar6;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> itgts;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> local_48;
  
  if (targetTypes == AllTargets) {
    for (p_Var5 = (mf->Targets)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
        p_Var5 = p_Var5->_M_nxt) {
      this_00 = (cmGeneratorTarget *)operator_new(0x500);
      cmGeneratorTarget::cmGeneratorTarget(this_00,(cmTarget *)(p_Var5 + 5),lg);
      cmLocalGenerator::AddGeneratorTarget(lg,this_00);
    }
  }
  cmMakefile::GetImportedTargets(&local_48,mf);
  if (local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var1 = &(importedMap->_M_t)._M_impl.super__Rb_tree_header;
    ppcVar6 = local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      p_Var3 = (importedMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var2 = &p_Var1->_M_header;
      if (p_Var3 != (_Base_ptr)0x0) {
        do {
          if (*(cmTarget **)(p_Var3 + 1) >= *ppcVar6) {
            p_Var2 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[*(cmTarget **)(p_Var3 + 1) < *ppcVar6];
        } while (p_Var3 != (_Base_ptr)0x0);
      }
      p_Var4 = p_Var1;
      if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
         (p_Var4 = (_Rb_tree_header *)p_Var2,
         *ppcVar6 < (cmTarget *)((_Rb_tree_header *)p_Var2)->_M_node_count)) {
        p_Var4 = p_Var1;
      }
      cmLocalGenerator::AddImportedGeneratorTarget(lg,*(cmGeneratorTarget **)(p_Var4 + 1));
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 !=
             local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(
    TargetTypes targetTypes,
    cmMakefile *mf,
    cmLocalGenerator *lg,
    std::map<cmTarget*, cmGeneratorTarget*> const& importedMap)
{
  if (targetTypes == AllTargets)
    {
    cmTargets& targets = mf->GetTargets();
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      cmTarget* t = &ti->second;
      cmGeneratorTarget* gt = new cmGeneratorTarget(t, lg);
      lg->AddGeneratorTarget(gt);
      }
    }

  std::vector<cmTarget*> itgts = mf->GetImportedTargets();

  for(std::vector<cmTarget*>::const_iterator
        j = itgts.begin(); j != itgts.end(); ++j)
    {
    lg->AddImportedGeneratorTarget(importedMap.find(*j)->second);
    }
}